

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::iterate
          (FeedbackPrimitiveTypeCase *this)

{
  ostringstream *poVar1;
  GeometryOutputType GVar2;
  RenderContext *pRVar3;
  undefined8 uVar4;
  TestLog *log;
  bool bVar5;
  undefined8 uVar6;
  GLuint GVar7;
  TextureFormat TVar8;
  char cVar9;
  bool bVar10;
  int i_1;
  int iVar11;
  int iVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar14;
  undefined4 extraout_var_01;
  void *pvVar15;
  ulong uVar16;
  TextureFormat TVar17;
  TextureFormat TVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  RenderTarget *pRVar19;
  TestError *pTVar20;
  ulong uVar21;
  int i;
  long lVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  TextureFormat TVar26;
  TextureFormat TVar27;
  TextureFormat TVar28;
  bool bVar29;
  int iVar30;
  float fVar31;
  ostringstream *this_00;
  long lVar32;
  float fVar33;
  float fVar34;
  GLuint primitivesGeneratedResult;
  float fStack_2a4;
  TextureFormat TStack_2a0;
  ulong local_298;
  float local_278;
  Vector<bool,_4> res_2;
  Surface feedbackResult;
  Surface nonFeedbackResult;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> feedbackResults;
  VertexArray vao;
  Vec4 generatedElementVertex;
  Query primitivesGeneratedQuery;
  Vector<float,_4> res_1;
  undefined1 local_1c8 [104];
  ios_base local_160 [264];
  Vector<float,_4> res;
  Vec4 equalThreshold;
  
  tcu::Surface::Surface(&feedbackResult,0x80,0x80);
  tcu::Surface::Surface(&nonFeedbackResult,0x80,0x80);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var,iVar11);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            (&vao.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar11),pOVar14);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&primitivesGeneratedQuery.super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar11),pOVar14);
  iVar12 = (**(code **)(lVar22 + 0x780))
                     ((this->m_feedbackProgram->m_program).m_program,"a_position");
  iVar11 = -1;
  if ((ulong)this->m_geometryOutputType < 3) {
    iVar11 = *(int *)(&DAT_009aafd8 + (ulong)this->m_geometryOutputType * 4);
  }
  if (iVar12 == -1) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    res_1.m_data._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res_1,"a_position was -1","");
    tcu::TestError::TestError(pTVar20,(string *)&res_1);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering with transform feedback",0x21);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar22 + 0x1a00))(0,0,feedbackResult.m_width,feedbackResult.m_height);
  (**(code **)(lVar22 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar22 + 0x188))(0x4000);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x412);
  (**(code **)(lVar22 + 0xd8))(vao.super_ObjectWrapper.m_object);
  (**(code **)(lVar22 + 0x40))(0x8892,this->m_patchBuffer);
  (**(code **)(lVar22 + 0x19f0))(iVar12,4,0x1406,0,0,0);
  (**(code **)(lVar22 + 0x610))(iVar12);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x418);
  (**(code **)(lVar22 + 0x1680))((this->m_feedbackProgram->m_program).m_program);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x41b);
  (**(code **)(lVar22 + 0xfd8))(0x8e72,4);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x41e);
  (**(code **)(lVar22 + 0x20))(0x8c87,primitivesGeneratedQuery.super_ObjectWrapper.m_object);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"begin GL_PRIMITIVES_GENERATED query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x421);
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Begin transform feedback with mode ",0x23);
  _primitivesGeneratedResult = glu::getPrimitiveTypeName;
  TStack_2a0.order = iVar11;
  tcu::Format::Enum<int,_2UL>::toStream
            ((Enum<int,_2UL> *)&primitivesGeneratedResult,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar22 + 0x30))(iVar11);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"begin xfb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x426);
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Calling drawArrays with mode GL_PATCHES",0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar22 + 0x538))(0xe,0,4);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x42b);
  (**(code **)(lVar22 + 0x638))();
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"end xfb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x42e);
  (**(code **)(lVar22 + 0x628))(0x8c87);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"end GL_PRIMITIVES_GENERATED query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x431);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  primitivesGeneratedResult = RGBA;
  fStack_2a4 = 4.2039e-45;
  pvVar15 = (void *)feedbackResult.m_pixels.m_cap;
  if (feedbackResult.m_pixels.m_cap != 0) {
    pvVar15 = feedbackResult.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_1,(TextureFormat *)&primitivesGeneratedResult,
             feedbackResult.m_width,feedbackResult.m_height,1,pvVar15);
  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&res_1);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x434);
  _primitivesGeneratedResult = (code *)((ulong)_primitivesGeneratedResult & 0xffffffff00000000);
  (**(code **)(lVar22 + 0xa20))(primitivesGeneratedQuery.super_ObjectWrapper.m_object,0x8866);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"get GL_PRIMITIVES_GENERATED value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x43a);
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying GL_PRIMITIVES_GENERATED, expecting ",0x2d);
  iVar11 = getNumTessellatedPrimitives(this);
  uVar23 = 1;
  if (this->m_tessellationPointMode == TESSELLATION_POINTMODE_OFF) {
    uVar23 = this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES ^ 3;
  }
  std::ostream::operator<<
            (poVar1,(uVar23 << (this->m_geometryOutputType == GEOMETRY_OUTPUT_LINES)) * iVar11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  GVar7 = primitivesGeneratedResult;
  iVar11 = getNumTessellatedPrimitives(this);
  uVar23 = 1;
  if (this->m_tessellationPointMode == TESSELLATION_POINTMODE_OFF) {
    uVar23 = this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES ^ 3;
  }
  if (GVar7 == (uVar23 << (this->m_geometryOutputType == GEOMETRY_OUTPUT_LINES)) * iVar11) {
    res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(res_1.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_PRIMITIVES_GENERATED valid.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_160);
  }
  else {
    res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(res_1.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Error, GL_PRIMITIVES_GENERATED was ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_160);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got unexpected GL_PRIMITIVES_GENERATED");
  }
  GVar2 = this->m_geometryOutputType;
  iVar11 = -1;
  if (GVar2 < GEOMETRY_OUTPUT_LAST) {
    iVar11 = GVar2 + GEOMETRY_OUTPUT_LINES;
  }
  iVar12 = getNumTessellatedPrimitives(this);
  uVar23 = 1;
  if (this->m_tessellationPointMode == TESSELLATION_POINTMODE_OFF) {
    uVar23 = this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES ^ 3;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&feedbackResults,
             (long)(int)(iVar12 * iVar11 * (uVar23 << (GVar2 == GEOMETRY_OUTPUT_LINES))),
             (allocator_type *)&res_1);
  pvVar15 = (void *)(**(code **)(lVar22 + 0xd00))
                              (0x8c8e,0,CONCAT44(feedbackResults.
                                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                 (int)feedbackResults.
                                                                                                            
                                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) -
                                        (long)feedbackResults.
                                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,1);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x44d);
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Reading transform feedback buffer.",0x22);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  if (pvVar15 == (void *)0x0) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    res_1.m_data._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&res_1,"mapBufferRange returned null","");
    tcu::TestError::TestError(pTVar20,(string *)&res_1);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  memcpy(feedbackResults.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar15,
         (long)((int)feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (int)feedbackResults.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0);
  cVar9 = (**(code **)(lVar22 + 0x1670))(0x8c8e);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"unmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x456);
  if (cVar9 != '\x01') {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    res_1.m_data._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&res_1,"unmapBuffer failed, did not return true","");
    tcu::TestError::TestError(pTVar20,(string *)&res_1);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar2 = this->m_geometryOutputType;
  uVar23 = this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES ^ 3;
  fVar31 = 1.4013e-45;
  if (this->m_tessellationPointMode != TESSELLATION_POINTMODE_OFF) {
    uVar23 = 1;
  }
  iVar11 = uVar23 << (GVar2 == GEOMETRY_OUTPUT_LINES);
  bVar10 = true;
  if (GVar2 != GEOMETRY_OUTPUT_POINTS) {
    if (GVar2 == GEOMETRY_OUTPUT_TRIANGLES) {
      fVar31 = 4.2039e-45;
    }
    else if (GVar2 == GEOMETRY_OUTPUT_LINES) {
      fVar31 = 2.8026e-45;
    }
    else {
      fVar31 = -NAN;
      bVar10 = false;
    }
  }
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying feedback results.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  iVar12 = getNumTessellatedPrimitives(this);
  if (iVar12 < 1) {
    iVar12 = 0 << (GVar2 == GEOMETRY_OUTPUT_LINES);
  }
  else {
    poVar1 = (ostringstream *)(res_1.m_data + 2);
    local_278 = fVar31;
    if ((int)fVar31 < 2) {
      local_278 = 1.4013e-45;
    }
    if (iVar11 < 2) {
      iVar11 = 1;
    }
    iVar12 = 0;
    iVar25 = 0;
    iVar30 = 0;
    do {
      this_00 = (ostringstream *)(res_1.m_data + 2);
      lVar22 = 0;
      do {
        (&primitivesGeneratedResult)[lVar22] =
             (GLuint)feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar30].m_data[lVar22];
        lVar22 = lVar22 + 1;
      } while (lVar22 != 4);
      if ((0.40000102 < ABS((float)primitivesGeneratedResult)) || (0.40000102 < ABS(fStack_2a4))) {
LAB_00579c1b:
        iVar24 = iVar12 + 1;
        bVar29 = true;
        bVar5 = iVar12 < 8;
        iVar12 = iVar24;
        if (bVar5) {
          res_1.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Element at index ",0x11);
          std::ostream::operator<<(this_00,iVar30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," (tessellation invocation ",0x1a);
          std::ostream::operator<<(this_00,iVar25);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     "\texpected vertex in range: ( [-0.4, 0.4], [-0.4, 0.4], 0.0, 1.0 )\n",0x42);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tgot: ",6);
          tcu::operator<<((ostream *)this_00,(Vector<float,_4> *)&primitivesGeneratedResult);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_160);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"invalid feedback output");
          iVar30 = iVar30 + 1;
          bVar29 = false;
        }
      }
      else {
        fVar31 = -(float)TStack_2a0.order;
        if (-(float)TStack_2a0.order <= (float)TStack_2a0.order) {
          fVar31 = (float)TStack_2a0.order;
        }
        if (1e-06 <= fVar31) goto LAB_00579c1b;
        fVar33 = (float)TStack_2a0.type + -1.0;
        fVar31 = -fVar33;
        if (-fVar33 <= fVar33) {
          fVar31 = fVar33;
        }
        bVar29 = true;
        if (1e-06 <= fVar31) goto LAB_00579c1b;
      }
      if (bVar29) {
        iVar24 = 0;
        do {
          if (bVar10) {
            fVar31 = 0.0;
            do {
              lVar22 = 0;
              do {
                generatedElementVertex.m_data[lVar22] =
                     feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar30].m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              lVar22 = 0;
              do {
                equalThreshold.m_data[lVar22] = 1e-06;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              res.m_data[0] = 0.0;
              res.m_data[1] = 0.0;
              res.m_data[2] = 0.0;
              res.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                res.m_data[lVar22] =
                     (float)(&primitivesGeneratedResult)[lVar22] -
                     generatedElementVertex.m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              res_1.m_data[0] = 0.0;
              res_1.m_data[1] = 0.0;
              res_1.m_data[2] = 0.0;
              res_1.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                fVar33 = res.m_data[lVar22];
                fVar34 = -fVar33;
                if (-fVar33 <= fVar33) {
                  fVar34 = fVar33;
                }
                res_1.m_data[lVar22] = fVar34;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              res_2.m_data[0] = false;
              res_2.m_data[1] = false;
              res_2.m_data[2] = false;
              res_2.m_data[3] = false;
              lVar22 = 0;
              do {
                res_2.m_data[lVar22] =
                     equalThreshold.m_data[lVar22] <= res_1.m_data[lVar22] &&
                     res_1.m_data[lVar22] != equalThreshold.m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              if (res_2.m_data[0] == false) {
                uVar16 = 0xffffffffffffffff;
                do {
                  if (uVar16 == 2) {
                    uVar21 = 3;
                    break;
                  }
                  uVar21 = uVar16 + 1;
                  lVar22 = uVar16 + 2;
                  uVar16 = uVar21;
                } while (res_2.m_data[lVar22] != true);
                if (uVar21 < 3) goto LAB_00579e2c;
              }
              else {
LAB_00579e2c:
                if (iVar12 < 8) {
                  res_1.m_data._0_8_ =
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"Element at index ",0x11);
                  std::ostream::operator<<(poVar1,iVar30);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1," (tessellation invocation ",0x1a);
                  std::ostream::operator<<(poVar1,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,", geometry primitive ",0x15);
                  std::ostream::operator<<(poVar1,iVar24);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,", emitted vertex ",0x11);
                  std::ostream::operator<<(poVar1,(int)fVar31);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"):\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,
                             "\tfeedback result was not contant over whole primitive.\n",0x37);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"\tfirst emitted value: ",0x16);
                  tcu::operator<<((ostream *)poVar1,(Vector<float,_4> *)&primitivesGeneratedResult);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"\tcurrent emitted value:",0x17);
                  tcu::operator<<((ostream *)poVar1,&generatedElementVertex);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_160);
                }
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,
                           "got multiple different feedback values for a single primitive");
                iVar12 = iVar12 + 1;
              }
              iVar30 = iVar30 + 1;
              fVar31 = (float)((int)fVar31 + 1);
            } while (fVar31 != local_278);
          }
          iVar24 = iVar24 + 1;
        } while (iVar24 != iVar11);
      }
      iVar25 = iVar25 + 1;
      iVar24 = getNumTessellatedPrimitives(this);
    } while (iVar25 < iVar24);
  }
  if (8 < iVar12) {
    res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(res_1.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
    std::ostream::operator<<(poVar1,iVar12 + -8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," error(s).",10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_160);
  }
  primitivesGeneratedResult = R;
  fStack_2a4 = 0.0;
  TStack_2a0.order = R;
  TStack_2a0.type = SNORM_INT8;
  local_298 = 0;
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Comparing result image against feedback results.",0x30);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  if (feedbackResults.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)CONCAT44(feedbackResults.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)feedbackResults.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    __unique_copy<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>const*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,std::back_insert_iterator<std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (feedbackResults.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (pointer)CONCAT44(feedbackResults.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)feedbackResults.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish),
               &primitivesGeneratedResult);
  }
  TVar8 = TStack_2a0;
  TVar18 = (TextureFormat)_primitivesGeneratedResult;
  if ((TextureFormat)_primitivesGeneratedResult != TStack_2a0) {
    lVar32 = (long)TStack_2a0 - (long)_primitivesGeneratedResult;
    uVar16 = lVar32 >> 4;
    lVar22 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(tcu::Vector<float,4>const&,tcu::Vector<float,4>const&)>>
              ((__normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                )_primitivesGeneratedResult,
               (__normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                )TStack_2a0,(ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_tcu::Vector<float,_4>_&,_const_tcu::Vector<float,_4>_&)>
                )0x57b705);
    TVar17 = TVar18;
    if (lVar32 < 0x101) {
      while (TVar26 = (TextureFormat)((long)TVar17 + 0x10), TVar26 != TVar8) {
        fVar31 = ((Vector<float,_4> *)((long)TVar17 + 0x10))->m_data[0];
        if ((fVar31 < *(float *)TVar18) ||
           ((fVar31 <= *(float *)TVar18 &&
            (*(float *)((long)TVar17 + 0x14) <= *(float *)((long)TVar18 + 4) &&
             *(float *)((long)TVar18 + 4) != *(float *)((long)TVar17 + 0x14))))) {
          res_1.m_data._0_8_ = *(undefined8 *)TVar26;
          res_1.m_data._8_8_ = *(undefined8 *)((long)TVar17 + 0x18);
          lVar22 = (long)TVar26 - (long)TVar18 >> 4;
          if (0 < lVar22) {
            lVar22 = lVar22 + 1;
            TVar17 = TVar26;
            do {
              *(undefined8 *)TVar17 =
                   *(undefined8 *)((Vector<float,_4> *)((long)TVar17 + -0x10))->m_data;
              *(undefined8 *)((long)TVar17 + 8) = *(undefined8 *)((long)TVar17 + -8);
              TVar17 = (TextureFormat)((long)TVar17 + -0x10);
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          *(undefined8 *)TVar18 = res_1.m_data._0_8_;
          *(undefined8 *)((long)TVar18 + 8) = res_1.m_data._8_8_;
          TVar17 = TVar26;
        }
        else {
          fVar33 = *(float *)((long)TVar17 + 0x14);
          uVar4 = *(undefined8 *)((long)TVar17 + 0x18);
          if (fVar31 < *(float *)TVar17) goto LAB_0057a340;
          TVar27 = TVar26;
          if (fVar31 <= *(float *)TVar17) {
            fVar34 = *(float *)((long)TVar17 + 4);
            while (fVar33 < fVar34) {
LAB_0057a340:
              do {
                TVar27 = TVar17;
                uVar6 = *(undefined8 *)((long)TVar27 + 8);
                *(undefined8 *)((Vector<float,_4> *)((long)TVar27 + 0x10))->m_data =
                     *(undefined8 *)TVar27;
                *(undefined8 *)((long)TVar27 + 0x18) = uVar6;
                TVar17 = (TextureFormat)((long)TVar27 + -0x10);
                fVar34 = ((Vector<float,_4> *)((long)TVar27 + -0x10))->m_data[0];
              } while (fVar31 < fVar34);
              if (fVar34 < fVar31) break;
              fVar34 = *(float *)((long)TVar27 + -0xc);
            }
          }
          *(float *)TVar27 = fVar31;
          *(float *)((long)TVar27 + 4) = fVar33;
          *(undefined8 *)((long)TVar27 + 8) = uVar4;
          TVar17 = TVar26;
        }
      }
    }
    else {
      TVar17 = (TextureFormat)((long)TVar18 + 0x100);
      TVar26 = TVar18;
      TVar27 = (TextureFormat)((long)TVar18 + 0x10);
      do {
        fVar31 = ((Vector<float,_4> *)((long)TVar26 + 0x10))->m_data[0];
        if ((fVar31 < *(float *)TVar18) ||
           ((fVar31 <= *(float *)TVar18 &&
            (*(float *)((long)TVar27 + 4) <= *(float *)((long)TVar18 + 4) &&
             *(float *)((long)TVar18 + 4) != *(float *)((long)TVar27 + 4))))) {
          res_1.m_data._0_8_ = *(undefined8 *)TVar27;
          res_1.m_data._8_8_ = *(undefined8 *)((long)TVar27 + 8);
          lVar22 = (long)TVar27 - (long)TVar18 >> 4;
          if (0 < lVar22) {
            lVar22 = lVar22 + 1;
            TVar26 = TVar27;
            do {
              *(undefined8 *)TVar26 =
                   *(undefined8 *)((Vector<float,_4> *)((long)TVar26 + -0x10))->m_data;
              *(undefined8 *)((long)TVar26 + 8) = *(undefined8 *)((long)TVar26 + -8);
              TVar26 = (TextureFormat)((long)TVar26 + -0x10);
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          *(undefined8 *)TVar18 = res_1.m_data._0_8_;
          *(undefined8 *)((long)TVar18 + 8) = res_1.m_data._8_8_;
        }
        else {
          fVar33 = *(float *)((long)TVar27 + 4);
          uVar4 = *(undefined8 *)((long)TVar27 + 8);
          if (fVar31 < *(float *)TVar26) goto LAB_0057a1e6;
          TVar28 = TVar27;
          if (fVar31 <= *(float *)TVar26) {
            fVar34 = *(float *)((long)TVar26 + 4);
            while (fVar33 < fVar34) {
LAB_0057a1e6:
              do {
                TVar28 = TVar26;
                uVar6 = *(undefined8 *)((long)TVar28 + 8);
                *(undefined8 *)((Vector<float,_4> *)((long)TVar28 + 0x10))->m_data =
                     *(undefined8 *)TVar28;
                *(undefined8 *)((long)TVar28 + 0x18) = uVar6;
                TVar26 = (TextureFormat)((long)TVar28 + -0x10);
                fVar34 = ((Vector<float,_4> *)((long)TVar28 + -0x10))->m_data[0];
              } while (fVar31 < fVar34);
              if (fVar34 < fVar31) break;
              fVar34 = *(float *)((long)TVar28 + -0xc);
            }
          }
          *(float *)TVar28 = fVar31;
          *(float *)((long)TVar28 + 4) = fVar33;
          *(undefined8 *)((long)TVar28 + 8) = uVar4;
        }
        TVar28 = (TextureFormat)((long)TVar27 + 0x10);
        TVar26 = TVar27;
        TVar27 = TVar28;
      } while (TVar28 != TVar17);
      for (; TVar17 != TVar8; TVar17 = (TextureFormat)((long)TVar17 + 0x10)) {
        fVar31 = ((Vector<float,_4> *)((long)TVar17 + -0x10))->m_data[0];
        fVar33 = *(float *)TVar17;
        fVar34 = *(float *)((long)TVar17 + 4);
        uVar4 = *(undefined8 *)((long)TVar17 + 8);
        TVar18 = TVar17;
        if ((fVar33 < fVar31) || ((fVar33 <= fVar31 && (fVar34 < *(float *)((long)TVar17 + -0xc)))))
        {
          while( true ) {
            *(undefined8 *)TVar18 =
                 *(undefined8 *)((Vector<float,_4> *)((long)TVar18 + -0x10))->m_data;
            *(undefined8 *)((long)TVar18 + 8) = *(undefined8 *)((long)TVar18 + -8);
            fVar31 = ((Vector<float,_4> *)((long)TVar18 + -0x20))->m_data[0];
            if ((fVar31 <= fVar33) &&
               ((fVar31 < fVar33 || (*(float *)((long)TVar18 + -0x1c) <= fVar34)))) break;
            TVar18 = (TextureFormat)((long)TVar18 + -0x10);
          }
          TVar18 = (TextureFormat)((long)TVar18 + -0x10);
        }
        *(float *)TVar18 = fVar33;
        *(float *)((long)TVar18 + 4) = fVar34;
        *(undefined8 *)((long)TVar18 + 8) = uVar4;
      }
    }
  }
  TVar18 = (TextureFormat)
           std::
           __unique<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (_primitivesGeneratedResult,TStack_2a0);
  if (TVar18 != TStack_2a0) {
    TStack_2a0 = TVar18;
  }
  if (0 < (int)((ulong)((long)TStack_2a0 - (long)_primitivesGeneratedResult) >> 4)) {
    lVar22 = 0;
    do {
      iVar12 = feedbackResult.m_height;
      iVar11 = feedbackResult.m_width;
      TVar18 = (TextureFormat)_primitivesGeneratedResult;
      local_278 = floorf((float)feedbackResult.m_width *
                         (((Vector<float,_4> *)((long)_primitivesGeneratedResult + lVar22 * 0x10))->
                          m_data[0] * 0.5 + 0.5) + 0.5);
      fVar31 = floorf((float)iVar12 * (((float *)((long)TVar18 + 4))[lVar22 * 4] * 0.5 + 0.5) + 0.5)
      ;
      generatedElementVertex.m_data[0] = (float)(int)local_278;
      generatedElementVertex.m_data[1] = (float)(int)fVar31;
      iVar25 = ((int)generatedElementVertex.m_data[1] + -2) * iVar11 +
               (int)generatedElementVertex.m_data[0];
      iVar30 = -2;
      bVar10 = false;
      do {
        if (!bVar10) {
          lVar32 = -2;
          bVar29 = bVar10;
          do {
            iVar24 = (int)generatedElementVertex.m_data[0] + (int)lVar32;
            bVar10 = true;
            if ((((-1 < iVar24) && (iVar24 < iVar11)) &&
                (-1 < iVar30 + (int)generatedElementVertex.m_data[1])) &&
               ((iVar30 + (int)generatedElementVertex.m_data[1] < iVar12 &&
                (bVar10 = bVar29,
                (*(uint *)((long)feedbackResult.m_pixels.m_ptr + (long)(iVar25 + (int)lVar32) * 4) &
                0xffffff) != 0)))) {
              bVar10 = true;
            }
          } while ((lVar32 < 2) && (lVar32 = lVar32 + 1, bVar29 = bVar10, !bVar10));
        }
        if (1 < iVar30) break;
        iVar30 = iVar30 + 1;
        iVar25 = iVar25 + iVar11;
      } while (!bVar10);
      poVar1 = (ostringstream *)(res_1.m_data + 2);
      if (!bVar10) {
        res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
        ;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex ",7);
        tcu::operator<<((ostream *)poVar1,
                        (Vector<float,_4> *)(lVar22 * 0x10 + (long)_primitivesGeneratedResult));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tCould not find rasterization output for vertex.\n",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected non-black pixels near ",0x20);
        tcu::operator<<((ostream *)poVar1,(Vector<int,_2> *)&generatedElementVertex);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_160);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"invalid result image");
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < (int)((ulong)((long)TStack_2a0 - (long)_primitivesGeneratedResult) >> 4));
  }
  if ((TextureFormat)_primitivesGeneratedResult != (TextureFormat)0x0) {
    operator_delete(_primitivesGeneratedResult,local_298 - (long)_primitivesGeneratedResult);
  }
  if (feedbackResults.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(feedbackResults.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)feedbackResults.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)feedbackResults.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&primitivesGeneratedQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var_02,iVar11);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&primitivesGeneratedResult,
             (Functions *)CONCAT44(extraout_var_03,iVar11),pOVar14);
  iVar11 = (**(code **)(lVar22 + 0x780))
                     ((this->m_nonFeedbackProgram->m_program).m_program,"a_position");
  if (iVar11 == -1) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    res_1.m_data._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res_1,"a_position was -1","");
    tcu::TestError::TestError(pTVar20,(string *)&res_1);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering without transform feedback",0x24);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar22 + 0x1a00))(0,0,nonFeedbackResult.m_width,nonFeedbackResult.m_height);
  (**(code **)(lVar22 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar22 + 0x188))(0x4000);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x471);
  (**(code **)(lVar22 + 0xd8))(local_298 & 0xffffffff);
  (**(code **)(lVar22 + 0x40))(0x8892,this->m_patchBuffer);
  (**(code **)(lVar22 + 0x19f0))(iVar11,4,0x1406,0,0,0);
  (**(code **)(lVar22 + 0x610))(iVar11);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x477);
  (**(code **)(lVar22 + 0x1680))((this->m_nonFeedbackProgram->m_program).m_program);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x47a);
  (**(code **)(lVar22 + 0xfd8))(0x8e72,4);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x47d);
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Calling drawArrays with mode GL_PATCHES",0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar22 + 0x538))(0xe,0,4);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x482);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  vao.super_ObjectWrapper.m_gl = (Functions *)0x300000008;
  pvVar15 = (void *)nonFeedbackResult.m_pixels.m_cap;
  if (nonFeedbackResult.m_pixels.m_cap != 0) {
    pvVar15 = nonFeedbackResult.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_1,(TextureFormat *)&vao,nonFeedbackResult.m_width,
             nonFeedbackResult.m_height,1,pvVar15);
  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&res_1);
  dVar13 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar13,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x485);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&primitivesGeneratedResult);
  res_1.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(res_1.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback."
             ,0x73);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (pRVar19->m_numSamples < 2) {
    primitivesGeneratedResult = RGBA;
    fStack_2a4 = 4.2039e-45;
    if (feedbackResult.m_pixels.m_cap != 0) {
      feedbackResult.m_pixels.m_cap = (size_t)feedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res_1,(TextureFormat *)&primitivesGeneratedResult,
               feedbackResult.m_width,feedbackResult.m_height,1,
               (void *)feedbackResult.m_pixels.m_cap);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x300000008;
    if (nonFeedbackResult.m_pixels.m_cap != 0) {
      nonFeedbackResult.m_pixels.m_cap = (size_t)nonFeedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&primitivesGeneratedResult,(TextureFormat *)&vao,
               nonFeedbackResult.m_width,nonFeedbackResult.m_height,1,
               (void *)nonFeedbackResult.m_pixels.m_cap);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x800000008;
    vao.super_ObjectWrapper.m_traits = (ObjectTraits *)0xff00000008;
    primitivesGeneratedQuery.super_ObjectWrapper.m_gl = (Functions *)0x100000001;
    primitivesGeneratedQuery.super_ObjectWrapper.m_traits._0_4_ = 0;
    bVar10 = tcu::intThresholdPositionDeviationCompare
                       (log,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)&res_1,
                        (ConstPixelBufferAccess *)&primitivesGeneratedResult,(UVec4 *)&vao,
                        (IVec3 *)&primitivesGeneratedQuery.super_ObjectWrapper,true,
                        COMPARE_LOG_RESULT);
  }
  else {
    primitivesGeneratedResult = RGBA;
    fStack_2a4 = 4.2039e-45;
    if (feedbackResult.m_pixels.m_cap != 0) {
      feedbackResult.m_pixels.m_cap = (size_t)feedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res_1,(TextureFormat *)&primitivesGeneratedResult,
               feedbackResult.m_width,feedbackResult.m_height,1,
               (void *)feedbackResult.m_pixels.m_cap);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x300000008;
    if (nonFeedbackResult.m_pixels.m_cap != 0) {
      nonFeedbackResult.m_pixels.m_cap = (size_t)nonFeedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&primitivesGeneratedResult,(TextureFormat *)&vao,
               nonFeedbackResult.m_width,nonFeedbackResult.m_height,1,
               (void *)nonFeedbackResult.m_pixels.m_cap);
    bVar10 = tcu::fuzzyCompare(log,"ImageCompare","Image comparison",
                               (ConstPixelBufferAccess *)&res_1,
                               (ConstPixelBufferAccess *)&primitivesGeneratedResult,0.03,
                               COMPARE_LOG_RESULT);
  }
  if (bVar10 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  tcu::Surface::~Surface(&nonFeedbackResult);
  tcu::Surface::~Surface(&feedbackResult);
  return STOP;
}

Assistant:

FeedbackPrimitiveTypeCase::IterateResult FeedbackPrimitiveTypeCase::iterate (void)
{
	tcu::Surface feedbackResult		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface nonFeedbackResult	(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// render with and without XFB
	renderWithFeedback(feedbackResult);
	renderWithoutFeedback(nonFeedbackResult);

	// compare
	{
		bool imageOk;

		m_testCtx.getLog() << tcu::TestLog::Message << "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback." << tcu::TestLog::EndMessage;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										feedbackResult.getAccess(),
										nonFeedbackResult.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																feedbackResult.getAccess(),
																nonFeedbackResult.getAccess(),
																tcu::UVec4(8, 8, 8, 255),						//!< threshold
																tcu::IVec3(1, 1, 0),							//!< 3x3 search kernel
																true,											//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (!imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}